

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

int Gia_ManTerRetire(Gia_ManTer_t *p,uint *pThis,uint *pPrev)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  uint *puVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  
  p->vRetired->nSize = 0;
  pGVar7 = p->pAig;
  if (pGVar7->nRegs < 1) {
    iVar5 = 0;
  }
  else {
    bVar10 = 0;
    uVar8 = 0;
    do {
      if (((pPrev[uVar8 >> 4] ^ pThis[uVar8 >> 4]) >> (bVar10 & 0x1e) & 3) != 0) {
        Vec_IntPush(p->vRetired,uVar8);
        pGVar7 = p->pAig;
      }
      uVar8 = uVar8 + 1;
      bVar10 = bVar10 + 2;
    } while ((int)uVar8 < pGVar7->nRegs);
    pVVar1 = p->vRetired;
    iVar5 = pVVar1->nSize;
    if (0 < iVar5) {
      piVar2 = pVVar1->pArray;
      puVar3 = p->pDataSimCis;
      pVVar4 = pGVar7->vCis;
      lVar9 = 0;
      do {
        iVar6 = (pVVar4->nSize - pGVar7->nRegs) + piVar2[lVar9];
        iVar5 = iVar6 >> 4;
        uVar8 = puVar3[iVar5];
        bVar10 = (char)iVar6 * '\x02';
        puVar3[iVar5] = (~(uVar8 >> (bVar10 & 0x1f)) & 3) << (bVar10 & 0x1f) ^ uVar8;
        lVar9 = lVar9 + 1;
        iVar5 = pVVar1->nSize;
      } while (lVar9 < iVar5);
    }
  }
  return iVar5;
}

Assistant:

int Gia_ManTerRetire( Gia_ManTer_t * p, unsigned * pThis, unsigned * pPrev )
{
    int i, Entry;
    // find registers whose value has changed
    Vec_IntClear( p->vRetired );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pThis, i ) != Gia_ManTerSimInfoGet( pPrev, i ) )
            Vec_IntPush( p->vRetired, i );
    // set all of them to zero
    Vec_IntForEachEntry( p->vRetired, Entry, i )
        Gia_ManTerSimInfoSet( p->pDataSimCis, Gia_ManPiNum(p->pAig)+Entry, GIA_UND );
    return Vec_IntSize(p->vRetired);
}